

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  int *piVar6;
  BYTE *pBVar7;
  ulong *puVar8;
  undefined8 *puVar9;
  uint uVar10;
  uint uVar11;
  BYTE *pBVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  bool bVar15;
  undefined8 uVar16;
  uint uVar17;
  uint uVar18;
  BYTE *pStart;
  ulong *puVar19;
  byte bVar20;
  byte bVar21;
  BYTE *pBVar22;
  ulong *puVar23;
  ulong *puVar24;
  seqDef *psVar25;
  U32 UVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ulong *puVar36;
  int iVar37;
  BYTE *pBVar38;
  uint uVar39;
  ulong uVar40;
  int iVar41;
  BYTE *litEnd;
  ulong uVar42;
  ulong *puVar43;
  ulong *puVar44;
  BYTE *litLimit_w;
  BYTE *base;
  BYTE *litLimit_w_3;
  BYTE *pInLoopLimit;
  BYTE *iend;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  U32 *hashSmall;
  
  pBVar12 = (ms->window).base;
  puVar5 = (ulong *)((long)src + srcSize);
  iVar41 = (int)pBVar12;
  iVar37 = (int)puVar5 - iVar41;
  uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar10 = (ms->window).dictLimit;
  uVar18 = iVar37 - uVar17;
  if (iVar37 - uVar10 <= uVar17) {
    uVar18 = uVar10;
  }
  pBVar38 = pBVar12 + uVar18;
  puVar8 = (ulong *)((long)src + (srcSize - 8));
  uVar10 = *rep;
  uVar17 = rep[1];
  puVar19 = (ulong *)((ulong)((int)src == (int)pBVar38) + (long)src);
  uVar29 = (int)puVar19 - (int)pBVar38;
  uVar42 = (ulong)uVar17;
  if (uVar29 < uVar17) {
    uVar42 = 0;
  }
  uVar27 = (uint)uVar42;
  uVar39 = 0;
  if (uVar10 <= uVar29) {
    uVar39 = uVar10;
  }
  uVar11 = (ms->cParams).minMatch;
  pUVar13 = ms->hashTable;
  pUVar14 = ms->chainTable;
  if (uVar11 == 5) {
    if (puVar19 < puVar8) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 + -7);
      puVar2 = (ulong *)((long)puVar5 + -3);
      puVar3 = (ulong *)((long)puVar5 + -1);
      puVar4 = puVar5 + -4;
LAB_00114e83:
      uVar28 = *puVar19;
      uVar31 = uVar28 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
      uVar35 = uVar28 * -0x30e4432345000000 >> (bVar21 & 0x3f);
      UVar26 = (int)puVar19 - iVar41;
      uVar27 = pUVar13[uVar31];
      uVar40 = (ulong)uVar27;
      uVar11 = pUVar14[uVar35];
      uVar34 = (ulong)uVar11;
      pUVar14[uVar35] = UVar26;
      pUVar13[uVar31] = UVar26;
      puVar36 = (ulong *)((long)puVar19 + 1);
      if ((uVar39 == 0) || (*(int *)((long)puVar36 - (ulong)uVar39) != *(int *)((long)puVar19 + 1)))
      {
        if ((uVar18 < uVar27) && (puVar44 = (ulong *)(pBVar12 + uVar40), *puVar44 == uVar28)) {
          puVar36 = puVar19 + 1;
          puVar23 = puVar44 + 1;
          puVar24 = puVar36;
          if (puVar36 < puVar1) {
            if (*puVar23 == *puVar36) {
              lVar32 = 0;
              do {
                puVar23 = (ulong *)((long)puVar19 + lVar32 + 0x10);
                if (puVar1 <= puVar23) {
                  puVar23 = (ulong *)(pBVar12 + lVar32 + uVar40 + 0x10);
                  puVar24 = (ulong *)((long)puVar19 + lVar32 + 0x10);
                  goto LAB_001153ab;
                }
                lVar33 = lVar32 + uVar40 + 0x10;
                uVar42 = *puVar23;
                lVar32 = lVar32 + 8;
              } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
              uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
              uVar28 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar28 = *puVar36 ^ *puVar23;
              uVar42 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = uVar42 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001153ab:
            if ((puVar24 < puVar2) && ((int)*puVar23 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar24 < puVar3) && ((short)*puVar23 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar24 < puVar5) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar24));
            }
            uVar42 = (long)puVar24 - (long)puVar36;
          }
          lVar32 = uVar42 + 8;
          uVar28 = (long)puVar19 - (long)puVar44;
          puVar36 = puVar19;
          if (src < puVar19) {
            pBVar22 = pBVar12 + (uVar40 - 1);
            puVar19 = (ulong *)((long)puVar19 + -1);
            do {
              if ((BYTE)*puVar19 != *pBVar22) goto LAB_0011559d;
              lVar32 = lVar32 + 1;
              puVar36 = (ulong *)((long)puVar19 + -1);
            } while ((pBVar38 < pBVar22) &&
                    (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
            goto LAB_00115598;
          }
          goto LAB_001155a3;
        }
        if ((uVar18 < uVar11) && (piVar6 = (int *)(pBVar12 + uVar34), *piVar6 == (int)*puVar19)) {
          uVar42 = *puVar36;
          uVar28 = uVar42 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          uVar27 = pUVar13[uVar28];
          uVar40 = (ulong)uVar27;
          pUVar13[uVar28] = UVar26 + 1;
          if ((uVar18 < uVar27) && (puVar44 = (ulong *)(pBVar12 + uVar40), *puVar44 == uVar42)) {
            puVar23 = (ulong *)((long)puVar19 + 9);
            puVar24 = puVar44 + 1;
            puVar43 = puVar23;
            if (puVar23 < puVar1) {
              if (*puVar24 == *puVar23) {
                lVar32 = 0;
                do {
                  puVar24 = (ulong *)((long)puVar19 + lVar32 + 0x11);
                  if (puVar1 <= puVar24) {
                    puVar24 = (ulong *)(pBVar12 + lVar32 + uVar40 + 0x10);
                    puVar43 = (ulong *)((long)puVar19 + lVar32 + 0x11);
                    goto LAB_00115513;
                  }
                  lVar33 = lVar32 + uVar40 + 0x10;
                  uVar42 = *puVar24;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
                uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
                uVar28 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar28 = *puVar23 ^ *puVar24;
                uVar42 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00115513:
              if ((puVar43 < puVar2) && ((int)*puVar24 == (int)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar43 < puVar3) && ((short)*puVar24 == (short)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar43 < puVar5) {
                puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar43));
              }
              uVar42 = (long)puVar43 - (long)puVar23;
            }
            lVar32 = uVar42 + 8;
            uVar28 = (long)puVar36 - (long)puVar44;
            if (src < puVar36) {
              pBVar22 = pBVar12 + (uVar40 - 1);
              do {
                if ((BYTE)*puVar19 != *pBVar22) goto LAB_0011559d;
                lVar32 = lVar32 + 1;
                puVar36 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar38 < pBVar22) &&
                      (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
LAB_00115598:
              puVar36 = (ulong *)((long)puVar36 + 1);
            }
          }
          else {
            puVar36 = (ulong *)((long)puVar19 + 4);
            puVar44 = (ulong *)(piVar6 + 1);
            puVar23 = puVar36;
            if (puVar36 < puVar1) {
              if (*puVar44 == *puVar36) {
                lVar32 = 0;
                do {
                  puVar44 = (ulong *)((long)puVar19 + lVar32 + 0xc);
                  if (puVar1 <= puVar44) {
                    puVar44 = (ulong *)(pBVar12 + lVar32 + uVar34 + 0xc);
                    puVar23 = (ulong *)((long)puVar19 + lVar32 + 0xc);
                    goto LAB_00115454;
                  }
                  lVar33 = lVar32 + uVar34 + 0xc;
                  uVar42 = *puVar44;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
                uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
                uVar28 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar28 = *puVar36 ^ *puVar44;
                uVar42 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00115454:
              if ((puVar23 < puVar2) && ((int)*puVar44 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar44 = (ulong *)((long)puVar44 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar44 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar44 = (ulong *)((long)puVar44 + 2);
              }
              if (puVar23 < puVar5) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar23));
              }
              uVar42 = (long)puVar23 - (long)puVar36;
            }
            lVar32 = uVar42 + 4;
            uVar28 = (long)puVar19 - (long)piVar6;
            puVar36 = puVar19;
            if (src < puVar19) {
              pBVar22 = pBVar12 + (uVar34 - 1);
              puVar19 = (ulong *)((long)puVar19 + -1);
              do {
                if ((BYTE)*puVar19 != *pBVar22) goto LAB_0011559d;
                lVar32 = lVar32 + 1;
                puVar36 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar38 < pBVar22) &&
                      (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
              goto LAB_00115598;
            }
          }
          goto LAB_001155a3;
        }
        puVar19 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
        goto LAB_001159a6;
      }
      lVar32 = -(ulong)uVar39;
      puVar44 = (ulong *)((long)puVar19 + 5);
      puVar24 = (ulong *)((long)puVar19 + lVar32 + 5);
      puVar23 = puVar44;
      if (puVar44 < puVar1) {
        if (*puVar24 == *puVar44) {
          lVar33 = 0;
          do {
            puVar23 = (ulong *)((long)puVar19 + lVar33 + 0xd);
            if (puVar1 <= puVar23) {
              puVar24 = (ulong *)((long)puVar19 + lVar32 + lVar33 + 0xd);
              puVar23 = (ulong *)((long)puVar19 + lVar33 + 0xd);
              goto LAB_001151a0;
            }
            uVar28 = *(ulong *)((long)puVar19 + lVar33 + lVar32 + 0xd);
            uVar40 = *puVar23;
            lVar33 = lVar33 + 8;
          } while (uVar28 == uVar40);
          uVar40 = uVar40 ^ uVar28;
          uVar28 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar40 = (uVar28 >> 3 & 0x1fffffff) + lVar33;
        }
        else {
          uVar40 = *puVar44 ^ *puVar24;
          uVar28 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar40 = uVar28 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_001151a0:
        if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
          puVar23 = (ulong *)((long)puVar23 + 4);
          puVar24 = (ulong *)((long)puVar24 + 4);
        }
        if ((puVar23 < puVar3) && ((short)*puVar24 == (short)*puVar23)) {
          puVar23 = (ulong *)((long)puVar23 + 2);
          puVar24 = (ulong *)((long)puVar24 + 2);
        }
        if (puVar23 < puVar5) {
          puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar23));
        }
        uVar40 = (long)puVar23 - (long)puVar44;
      }
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar28 = (long)puVar36 - (long)src;
          puVar19 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar19 + uVar28) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar36 <= puVar5) {
              if (puVar4 < puVar36) {
                ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar36,(BYTE *)puVar4);
LAB_00115259:
                seqStore->lit = seqStore->lit + uVar28;
                if (0xffff < uVar28) {
                  if (seqStore->longLengthID != 0) goto LAB_00116724;
                  seqStore->longLengthID = 1;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
              }
              else {
                uVar34 = *(ulong *)((long)src + 8);
                *puVar19 = *src;
                puVar19[1] = uVar34;
                pBVar22 = seqStore->lit;
                if (0x10 < uVar28) {
                  lVar32 = (long)(pBVar22 + 0x10) - ((long)src + 0x10);
                  if (lVar32 < 8) {
                    if (-0x10 < lVar32) goto LAB_00116743;
                  }
                  else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00116762;
                  uVar34 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar22 + 0x18) = uVar34;
                  if (0x20 < (long)uVar28) {
                    lVar32 = 0;
                    do {
                      puVar9 = (undefined8 *)((long)src + lVar32 + 0x20);
                      uVar16 = puVar9[1];
                      pBVar7 = pBVar22 + lVar32 + 0x20;
                      *(undefined8 *)pBVar7 = *puVar9;
                      *(undefined8 *)(pBVar7 + 8) = uVar16;
                      puVar9 = (undefined8 *)((long)src + lVar32 + 0x30);
                      uVar16 = puVar9[1];
                      *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
                      *(undefined8 *)(pBVar7 + 0x18) = uVar16;
                      lVar32 = lVar32 + 0x20;
                    } while (pBVar7 + 0x20 < pBVar22 + uVar28);
                  }
                  goto LAB_00115259;
                }
                seqStore->lit = pBVar22 + uVar28;
              }
              lVar32 = uVar40 + 4;
              uVar40 = uVar40 + 1;
              psVar25 = seqStore->sequences;
              psVar25->litLength = (U16)uVar28;
              psVar25->offset = 1;
              if (uVar40 < 0x10000) goto LAB_001156d6;
              if (seqStore->longLengthID == 0) goto LAB_001156c0;
              goto LAB_00116705;
            }
            goto LAB_001166a8;
          }
          goto LAB_00116689;
        }
        goto LAB_001166e6;
      }
      goto LAB_001166c7;
    }
  }
  else if (uVar11 == 6) {
    if (puVar19 < puVar8) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 + -7);
      puVar2 = (ulong *)((long)puVar5 + -3);
      puVar3 = (ulong *)((long)puVar5 + -1);
      puVar4 = puVar5 + -4;
LAB_00114264:
      uVar28 = *puVar19;
      uVar31 = uVar28 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
      uVar35 = uVar28 * -0x30e4432340650000 >> (bVar21 & 0x3f);
      UVar26 = (int)puVar19 - iVar41;
      uVar27 = pUVar13[uVar31];
      uVar40 = (ulong)uVar27;
      uVar11 = pUVar14[uVar35];
      uVar34 = (ulong)uVar11;
      pUVar14[uVar35] = UVar26;
      pUVar13[uVar31] = UVar26;
      puVar36 = (ulong *)((long)puVar19 + 1);
      if ((uVar39 == 0) || (*(int *)((long)puVar36 - (ulong)uVar39) != *(int *)((long)puVar19 + 1)))
      {
        if ((uVar18 < uVar27) && (puVar44 = (ulong *)(pBVar12 + uVar40), *puVar44 == uVar28)) {
          puVar36 = puVar19 + 1;
          puVar23 = puVar44 + 1;
          puVar24 = puVar36;
          if (puVar36 < puVar1) {
            if (*puVar23 == *puVar36) {
              lVar32 = 0;
              do {
                puVar23 = (ulong *)((long)puVar19 + lVar32 + 0x10);
                if (puVar1 <= puVar23) {
                  puVar23 = (ulong *)(pBVar12 + lVar32 + uVar40 + 0x10);
                  puVar24 = (ulong *)((long)puVar19 + lVar32 + 0x10);
                  goto LAB_0011478c;
                }
                lVar33 = lVar32 + uVar40 + 0x10;
                uVar42 = *puVar23;
                lVar32 = lVar32 + 8;
              } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
              uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
              uVar28 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar28 = *puVar36 ^ *puVar23;
              uVar42 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = uVar42 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0011478c:
            if ((puVar24 < puVar2) && ((int)*puVar23 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar24 < puVar3) && ((short)*puVar23 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar24 < puVar5) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar24));
            }
            uVar42 = (long)puVar24 - (long)puVar36;
          }
          lVar32 = uVar42 + 8;
          uVar28 = (long)puVar19 - (long)puVar44;
          puVar36 = puVar19;
          if (src < puVar19) {
            pBVar22 = pBVar12 + (uVar40 - 1);
            puVar19 = (ulong *)((long)puVar19 + -1);
            do {
              if ((BYTE)*puVar19 != *pBVar22) goto LAB_0011497e;
              lVar32 = lVar32 + 1;
              puVar36 = (ulong *)((long)puVar19 + -1);
            } while ((pBVar38 < pBVar22) &&
                    (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
            goto LAB_00114979;
          }
          goto LAB_00114984;
        }
        if ((uVar18 < uVar11) && (piVar6 = (int *)(pBVar12 + uVar34), *piVar6 == (int)*puVar19)) {
          uVar42 = *puVar36;
          uVar28 = uVar42 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          uVar27 = pUVar13[uVar28];
          uVar40 = (ulong)uVar27;
          pUVar13[uVar28] = UVar26 + 1;
          if ((uVar18 < uVar27) && (puVar44 = (ulong *)(pBVar12 + uVar40), *puVar44 == uVar42)) {
            puVar23 = (ulong *)((long)puVar19 + 9);
            puVar24 = puVar44 + 1;
            puVar43 = puVar23;
            if (puVar23 < puVar1) {
              if (*puVar24 == *puVar23) {
                lVar32 = 0;
                do {
                  puVar24 = (ulong *)((long)puVar19 + lVar32 + 0x11);
                  if (puVar1 <= puVar24) {
                    puVar24 = (ulong *)(pBVar12 + lVar32 + uVar40 + 0x10);
                    puVar43 = (ulong *)((long)puVar19 + lVar32 + 0x11);
                    goto LAB_001148f4;
                  }
                  lVar33 = lVar32 + uVar40 + 0x10;
                  uVar42 = *puVar24;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
                uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
                uVar28 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar28 = *puVar23 ^ *puVar24;
                uVar42 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001148f4:
              if ((puVar43 < puVar2) && ((int)*puVar24 == (int)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar43 < puVar3) && ((short)*puVar24 == (short)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar43 < puVar5) {
                puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar43));
              }
              uVar42 = (long)puVar43 - (long)puVar23;
            }
            lVar32 = uVar42 + 8;
            uVar28 = (long)puVar36 - (long)puVar44;
            if (src < puVar36) {
              pBVar22 = pBVar12 + (uVar40 - 1);
              do {
                if ((BYTE)*puVar19 != *pBVar22) goto LAB_0011497e;
                lVar32 = lVar32 + 1;
                puVar36 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar38 < pBVar22) &&
                      (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
LAB_00114979:
              puVar36 = (ulong *)((long)puVar36 + 1);
            }
          }
          else {
            puVar36 = (ulong *)((long)puVar19 + 4);
            puVar44 = (ulong *)(piVar6 + 1);
            puVar23 = puVar36;
            if (puVar36 < puVar1) {
              if (*puVar44 == *puVar36) {
                lVar32 = 0;
                do {
                  puVar44 = (ulong *)((long)puVar19 + lVar32 + 0xc);
                  if (puVar1 <= puVar44) {
                    puVar44 = (ulong *)(pBVar12 + lVar32 + uVar34 + 0xc);
                    puVar23 = (ulong *)((long)puVar19 + lVar32 + 0xc);
                    goto LAB_00114835;
                  }
                  lVar33 = lVar32 + uVar34 + 0xc;
                  uVar42 = *puVar44;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
                uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
                uVar28 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar28 = *puVar36 ^ *puVar44;
                uVar42 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00114835:
              if ((puVar23 < puVar2) && ((int)*puVar44 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar44 = (ulong *)((long)puVar44 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar44 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar44 = (ulong *)((long)puVar44 + 2);
              }
              if (puVar23 < puVar5) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar23));
              }
              uVar42 = (long)puVar23 - (long)puVar36;
            }
            lVar32 = uVar42 + 4;
            uVar28 = (long)puVar19 - (long)piVar6;
            puVar36 = puVar19;
            if (src < puVar19) {
              pBVar22 = pBVar12 + (uVar34 - 1);
              puVar19 = (ulong *)((long)puVar19 + -1);
              do {
                if ((BYTE)*puVar19 != *pBVar22) goto LAB_0011497e;
                lVar32 = lVar32 + 1;
                puVar36 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar38 < pBVar22) &&
                      (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
              goto LAB_00114979;
            }
          }
          goto LAB_00114984;
        }
        puVar19 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
        goto LAB_00114d87;
      }
      lVar32 = -(ulong)uVar39;
      puVar44 = (ulong *)((long)puVar19 + 5);
      puVar24 = (ulong *)((long)puVar19 + lVar32 + 5);
      puVar23 = puVar44;
      if (puVar44 < puVar1) {
        if (*puVar24 == *puVar44) {
          lVar33 = 0;
          do {
            puVar23 = (ulong *)((long)puVar19 + lVar33 + 0xd);
            if (puVar1 <= puVar23) {
              puVar24 = (ulong *)((long)puVar19 + lVar32 + lVar33 + 0xd);
              puVar23 = (ulong *)((long)puVar19 + lVar33 + 0xd);
              goto LAB_00114581;
            }
            uVar28 = *(ulong *)((long)puVar19 + lVar33 + lVar32 + 0xd);
            uVar40 = *puVar23;
            lVar33 = lVar33 + 8;
          } while (uVar28 == uVar40);
          uVar40 = uVar40 ^ uVar28;
          uVar28 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar40 = (uVar28 >> 3 & 0x1fffffff) + lVar33;
        }
        else {
          uVar40 = *puVar44 ^ *puVar24;
          uVar28 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar40 = uVar28 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00114581:
        if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
          puVar23 = (ulong *)((long)puVar23 + 4);
          puVar24 = (ulong *)((long)puVar24 + 4);
        }
        if ((puVar23 < puVar3) && ((short)*puVar24 == (short)*puVar23)) {
          puVar23 = (ulong *)((long)puVar23 + 2);
          puVar24 = (ulong *)((long)puVar24 + 2);
        }
        if (puVar23 < puVar5) {
          puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar23));
        }
        uVar40 = (long)puVar23 - (long)puVar44;
      }
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar28 = (long)puVar36 - (long)src;
          puVar19 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar19 + uVar28) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar36 <= puVar5) {
              if (puVar4 < puVar36) {
                ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar36,(BYTE *)puVar4);
LAB_0011463a:
                seqStore->lit = seqStore->lit + uVar28;
                if (0xffff < uVar28) {
                  if (seqStore->longLengthID != 0) goto LAB_00116724;
                  seqStore->longLengthID = 1;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
              }
              else {
                uVar34 = *(ulong *)((long)src + 8);
                *puVar19 = *src;
                puVar19[1] = uVar34;
                pBVar22 = seqStore->lit;
                if (0x10 < uVar28) {
                  lVar32 = (long)(pBVar22 + 0x10) - ((long)src + 0x10);
                  if (lVar32 < 8) {
                    if (-0x10 < lVar32) goto LAB_00116743;
                  }
                  else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00116762;
                  uVar34 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar22 + 0x18) = uVar34;
                  if (0x20 < (long)uVar28) {
                    lVar32 = 0;
                    do {
                      puVar9 = (undefined8 *)((long)src + lVar32 + 0x20);
                      uVar16 = puVar9[1];
                      pBVar7 = pBVar22 + lVar32 + 0x20;
                      *(undefined8 *)pBVar7 = *puVar9;
                      *(undefined8 *)(pBVar7 + 8) = uVar16;
                      puVar9 = (undefined8 *)((long)src + lVar32 + 0x30);
                      uVar16 = puVar9[1];
                      *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
                      *(undefined8 *)(pBVar7 + 0x18) = uVar16;
                      lVar32 = lVar32 + 0x20;
                    } while (pBVar7 + 0x20 < pBVar22 + uVar28);
                  }
                  goto LAB_0011463a;
                }
                seqStore->lit = pBVar22 + uVar28;
              }
              lVar32 = uVar40 + 4;
              uVar40 = uVar40 + 1;
              psVar25 = seqStore->sequences;
              psVar25->litLength = (U16)uVar28;
              psVar25->offset = 1;
              if (uVar40 < 0x10000) goto LAB_00114ab7;
              if (seqStore->longLengthID == 0) goto LAB_00114aa1;
              goto LAB_00116705;
            }
            goto LAB_001166a8;
          }
          goto LAB_00116689;
        }
        goto LAB_001166e6;
      }
      goto LAB_001166c7;
    }
  }
  else if (uVar11 == 7) {
    if (puVar19 < puVar8) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      bVar21 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
LAB_00113645:
      uVar28 = *puVar19;
      uVar31 = uVar28 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
      uVar35 = uVar28 * -0x30e44323405a9d00 >> (bVar21 & 0x3f);
      UVar26 = (int)puVar19 - iVar41;
      uVar27 = pUVar13[uVar31];
      uVar40 = (ulong)uVar27;
      uVar11 = pUVar14[uVar35];
      uVar34 = (ulong)uVar11;
      pUVar14[uVar35] = UVar26;
      pUVar13[uVar31] = UVar26;
      puVar36 = (ulong *)((long)puVar19 + 1);
      if ((uVar39 == 0) || (*(int *)((long)puVar36 - (ulong)uVar39) != *(int *)((long)puVar19 + 1)))
      {
        if ((uVar18 < uVar27) && (puVar44 = (ulong *)(pBVar12 + uVar40), *puVar44 == uVar28)) {
          puVar36 = puVar19 + 1;
          puVar23 = puVar44 + 1;
          puVar24 = puVar36;
          if (puVar36 < puVar1) {
            if (*puVar23 == *puVar36) {
              lVar32 = 0;
              do {
                puVar23 = (ulong *)((long)puVar19 + lVar32 + 0x10);
                if (puVar1 <= puVar23) {
                  puVar23 = (ulong *)(pBVar12 + lVar32 + uVar40 + 0x10);
                  puVar24 = (ulong *)((long)puVar19 + lVar32 + 0x10);
                  goto LAB_00113b6d;
                }
                lVar33 = lVar32 + uVar40 + 0x10;
                uVar42 = *puVar23;
                lVar32 = lVar32 + 8;
              } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
              uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
              uVar28 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar28 = *puVar36 ^ *puVar23;
              uVar42 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = uVar42 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00113b6d:
            if ((puVar24 < puVar2) && ((int)*puVar23 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar24 < puVar3) && ((short)*puVar23 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar24 < puVar5) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar24));
            }
            uVar42 = (long)puVar24 - (long)puVar36;
          }
          lVar32 = uVar42 + 8;
          uVar28 = (long)puVar19 - (long)puVar44;
          puVar36 = puVar19;
          if (src < puVar19) {
            pBVar22 = pBVar12 + (uVar40 - 1);
            puVar19 = (ulong *)((long)puVar19 + -1);
            do {
              if ((BYTE)*puVar19 != *pBVar22) goto LAB_00113d5f;
              lVar32 = lVar32 + 1;
              puVar36 = (ulong *)((long)puVar19 + -1);
            } while ((pBVar38 < pBVar22) &&
                    (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
            goto LAB_00113d5a;
          }
          goto LAB_00113d65;
        }
        if ((uVar18 < uVar11) && (piVar6 = (int *)(pBVar12 + uVar34), *piVar6 == (int)*puVar19)) {
          uVar42 = *puVar36;
          uVar28 = uVar42 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          uVar27 = pUVar13[uVar28];
          uVar40 = (ulong)uVar27;
          pUVar13[uVar28] = UVar26 + 1;
          if ((uVar18 < uVar27) && (puVar44 = (ulong *)(pBVar12 + uVar40), *puVar44 == uVar42)) {
            puVar23 = (ulong *)((long)puVar19 + 9);
            puVar24 = puVar44 + 1;
            puVar43 = puVar23;
            if (puVar23 < puVar1) {
              if (*puVar24 == *puVar23) {
                lVar32 = 0;
                do {
                  puVar24 = (ulong *)((long)puVar19 + lVar32 + 0x11);
                  if (puVar1 <= puVar24) {
                    puVar24 = (ulong *)(pBVar12 + lVar32 + uVar40 + 0x10);
                    puVar43 = (ulong *)((long)puVar19 + lVar32 + 0x11);
                    goto LAB_00113cd5;
                  }
                  lVar33 = lVar32 + uVar40 + 0x10;
                  uVar42 = *puVar24;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
                uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
                uVar28 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar28 = *puVar23 ^ *puVar24;
                uVar42 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00113cd5:
              if ((puVar43 < puVar2) && ((int)*puVar24 == (int)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar43 < puVar3) && ((short)*puVar24 == (short)*puVar43)) {
                puVar43 = (ulong *)((long)puVar43 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar43 < puVar5) {
                puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar43));
              }
              uVar42 = (long)puVar43 - (long)puVar23;
            }
            lVar32 = uVar42 + 8;
            uVar28 = (long)puVar36 - (long)puVar44;
            if (src < puVar36) {
              pBVar22 = pBVar12 + (uVar40 - 1);
              do {
                if ((BYTE)*puVar19 != *pBVar22) goto LAB_00113d5f;
                lVar32 = lVar32 + 1;
                puVar36 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar38 < pBVar22) &&
                      (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
LAB_00113d5a:
              puVar36 = (ulong *)((long)puVar36 + 1);
            }
          }
          else {
            puVar36 = (ulong *)((long)puVar19 + 4);
            puVar44 = (ulong *)(piVar6 + 1);
            puVar23 = puVar36;
            if (puVar36 < puVar1) {
              if (*puVar44 == *puVar36) {
                lVar32 = 0;
                do {
                  puVar44 = (ulong *)((long)puVar19 + lVar32 + 0xc);
                  if (puVar1 <= puVar44) {
                    puVar44 = (ulong *)(pBVar12 + lVar32 + uVar34 + 0xc);
                    puVar23 = (ulong *)((long)puVar19 + lVar32 + 0xc);
                    goto LAB_00113c16;
                  }
                  lVar33 = lVar32 + uVar34 + 0xc;
                  uVar42 = *puVar44;
                  lVar32 = lVar32 + 8;
                } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
                uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
                uVar28 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
              }
              else {
                uVar28 = *puVar36 ^ *puVar44;
                uVar42 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                uVar42 = uVar42 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00113c16:
              if ((puVar23 < puVar2) && ((int)*puVar44 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar44 = (ulong *)((long)puVar44 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar44 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar44 = (ulong *)((long)puVar44 + 2);
              }
              if (puVar23 < puVar5) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar23));
              }
              uVar42 = (long)puVar23 - (long)puVar36;
            }
            lVar32 = uVar42 + 4;
            uVar28 = (long)puVar19 - (long)piVar6;
            puVar36 = puVar19;
            if (src < puVar19) {
              pBVar22 = pBVar12 + (uVar34 - 1);
              puVar19 = (ulong *)((long)puVar19 + -1);
              do {
                if ((BYTE)*puVar19 != *pBVar22) goto LAB_00113d5f;
                lVar32 = lVar32 + 1;
                puVar36 = (ulong *)((long)puVar19 + -1);
              } while ((pBVar38 < pBVar22) &&
                      (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
              goto LAB_00113d5a;
            }
          }
          goto LAB_00113d65;
        }
        puVar19 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
        goto LAB_00114168;
      }
      lVar32 = -(ulong)uVar39;
      puVar44 = (ulong *)((long)puVar19 + 5);
      puVar24 = (ulong *)((long)puVar19 + lVar32 + 5);
      puVar23 = puVar44;
      if (puVar44 < puVar1) {
        if (*puVar24 == *puVar44) {
          lVar33 = 0;
          do {
            puVar23 = (ulong *)((long)puVar19 + lVar33 + 0xd);
            if (puVar1 <= puVar23) {
              puVar24 = (ulong *)((long)puVar19 + lVar32 + lVar33 + 0xd);
              puVar23 = (ulong *)((long)puVar19 + lVar33 + 0xd);
              goto LAB_00113962;
            }
            uVar28 = *(ulong *)((long)puVar19 + lVar33 + lVar32 + 0xd);
            uVar40 = *puVar23;
            lVar33 = lVar33 + 8;
          } while (uVar28 == uVar40);
          uVar40 = uVar40 ^ uVar28;
          uVar28 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar40 = (uVar28 >> 3 & 0x1fffffff) + lVar33;
        }
        else {
          uVar40 = *puVar44 ^ *puVar24;
          uVar28 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar40 = uVar28 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00113962:
        if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
          puVar23 = (ulong *)((long)puVar23 + 4);
          puVar24 = (ulong *)((long)puVar24 + 4);
        }
        if ((puVar23 < puVar3) && ((short)*puVar24 == (short)*puVar23)) {
          puVar23 = (ulong *)((long)puVar23 + 2);
          puVar24 = (ulong *)((long)puVar24 + 2);
        }
        if (puVar23 < puVar5) {
          puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar23));
        }
        uVar40 = (long)puVar23 - (long)puVar44;
      }
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar28 = (long)puVar36 - (long)src;
          puVar19 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar19 + uVar28) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar36 <= puVar5) {
              if (puVar4 < puVar36) {
                ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar36,(BYTE *)puVar4);
LAB_00113a1b:
                seqStore->lit = seqStore->lit + uVar28;
                if (0xffff < uVar28) {
                  if (seqStore->longLengthID != 0) goto LAB_00116724;
                  seqStore->longLengthID = 1;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
              }
              else {
                uVar34 = *(ulong *)((long)src + 8);
                *puVar19 = *src;
                puVar19[1] = uVar34;
                pBVar22 = seqStore->lit;
                if (0x10 < uVar28) {
                  lVar32 = (long)(pBVar22 + 0x10) - ((long)src + 0x10);
                  if (lVar32 < 8) {
                    if (-0x10 < lVar32) goto LAB_00116743;
                  }
                  else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00116762;
                  uVar34 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar22 + 0x18) = uVar34;
                  if (0x20 < (long)uVar28) {
                    lVar32 = 0;
                    do {
                      puVar9 = (undefined8 *)((long)src + lVar32 + 0x20);
                      uVar16 = puVar9[1];
                      pBVar7 = pBVar22 + lVar32 + 0x20;
                      *(undefined8 *)pBVar7 = *puVar9;
                      *(undefined8 *)(pBVar7 + 8) = uVar16;
                      puVar9 = (undefined8 *)((long)src + lVar32 + 0x30);
                      uVar16 = puVar9[1];
                      *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
                      *(undefined8 *)(pBVar7 + 0x18) = uVar16;
                      lVar32 = lVar32 + 0x20;
                    } while (pBVar7 + 0x20 < pBVar22 + uVar28);
                  }
                  goto LAB_00113a1b;
                }
                seqStore->lit = pBVar22 + uVar28;
              }
              lVar32 = uVar40 + 4;
              uVar40 = uVar40 + 1;
              psVar25 = seqStore->sequences;
              psVar25->litLength = (U16)uVar28;
              psVar25->offset = 1;
              if (uVar40 < 0x10000) goto LAB_00113e98;
              if (seqStore->longLengthID == 0) goto LAB_00113e82;
              goto LAB_00116705;
            }
            goto LAB_001166a8;
          }
          goto LAB_00116689;
        }
        goto LAB_001166e6;
      }
      goto LAB_001166c7;
    }
  }
  else if (puVar19 < puVar8) {
    bVar20 = 0x40 - (char)(ms->cParams).hashLog;
    bVar21 = 0x20 - (char)(ms->cParams).chainLog;
    puVar1 = (ulong *)((long)puVar5 + -7);
    puVar2 = (ulong *)((long)puVar5 + -3);
    puVar3 = (ulong *)((long)puVar5 + -1);
    puVar4 = puVar5 + -4;
LAB_00115a85:
    uVar34 = *puVar19 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
    uVar30 = (uint)((int)*puVar19 * -0x61c8864f) >> (bVar21 & 0x1f);
    UVar26 = (int)puVar19 - iVar41;
    uVar27 = pUVar13[uVar34];
    uVar28 = (ulong)uVar27;
    uVar11 = pUVar14[uVar30];
    uVar40 = (ulong)uVar11;
    pUVar14[uVar30] = UVar26;
    pUVar13[uVar34] = UVar26;
    puVar36 = (ulong *)((long)puVar19 + 1);
    if ((uVar39 == 0) || (*(int *)((long)puVar36 - (ulong)uVar39) != *(int *)((long)puVar19 + 1))) {
      if ((uVar18 < uVar27) && (puVar44 = (ulong *)(pBVar12 + uVar28), *puVar44 == *puVar19)) {
        puVar36 = puVar19 + 1;
        puVar23 = puVar44 + 1;
        puVar24 = puVar36;
        if (puVar36 < puVar1) {
          if (*puVar23 == *puVar36) {
            lVar32 = 0;
            do {
              puVar23 = (ulong *)((long)puVar19 + lVar32 + 0x10);
              if (puVar1 <= puVar23) {
                puVar23 = (ulong *)(pBVar12 + lVar32 + uVar28 + 0x10);
                puVar24 = (ulong *)((long)puVar19 + lVar32 + 0x10);
                goto LAB_00115fb0;
              }
              lVar33 = lVar32 + uVar28 + 0x10;
              uVar42 = *puVar23;
              lVar32 = lVar32 + 8;
            } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
            uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
            uVar40 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
            uVar42 = (uVar40 >> 3 & 0x1fffffff) + lVar32;
          }
          else {
            uVar40 = *puVar36 ^ *puVar23;
            uVar42 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
              }
            }
            uVar42 = uVar42 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00115fb0:
          if ((puVar24 < puVar2) && ((int)*puVar23 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar23 = (ulong *)((long)puVar23 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar23 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar23 = (ulong *)((long)puVar23 + 2);
          }
          if (puVar24 < puVar5) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar24));
          }
          uVar42 = (long)puVar24 - (long)puVar36;
        }
        lVar32 = uVar42 + 8;
        uVar34 = (long)puVar19 - (long)puVar44;
        puVar36 = puVar19;
        if (src < puVar19) {
          pBVar22 = pBVar12 + (uVar28 - 1);
          puVar19 = (ulong *)((long)puVar19 + -1);
          do {
            if ((BYTE)*puVar19 != *pBVar22) goto LAB_001161ac;
            lVar32 = lVar32 + 1;
            puVar36 = (ulong *)((long)puVar19 + -1);
          } while ((pBVar38 < pBVar22) &&
                  (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
          goto LAB_001161a7;
        }
        goto LAB_001161b2;
      }
      if ((uVar18 < uVar11) && (piVar6 = (int *)(pBVar12 + uVar40), *piVar6 == (int)*puVar19)) {
        uVar42 = *puVar36;
        uVar34 = uVar42 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        uVar27 = pUVar13[uVar34];
        uVar28 = (ulong)uVar27;
        pUVar13[uVar34] = UVar26 + 1;
        if ((uVar18 < uVar27) && (puVar44 = (ulong *)(pBVar12 + uVar28), *puVar44 == uVar42)) {
          puVar23 = (ulong *)((long)puVar19 + 9);
          puVar24 = puVar44 + 1;
          puVar43 = puVar23;
          if (puVar23 < puVar1) {
            if (*puVar24 == *puVar23) {
              lVar32 = 0;
              do {
                puVar24 = (ulong *)((long)puVar19 + lVar32 + 0x11);
                if (puVar1 <= puVar24) {
                  puVar24 = (ulong *)(pBVar12 + lVar32 + uVar28 + 0x10);
                  puVar43 = (ulong *)((long)puVar19 + lVar32 + 0x11);
                  goto LAB_0011611f;
                }
                lVar33 = lVar32 + uVar28 + 0x10;
                uVar42 = *puVar24;
                lVar32 = lVar32 + 8;
              } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
              uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
              uVar40 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar42 = (uVar40 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar40 = *puVar23 ^ *puVar24;
              uVar42 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = uVar42 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0011611f:
            if ((puVar43 < puVar2) && ((int)*puVar24 == (int)*puVar43)) {
              puVar43 = (ulong *)((long)puVar43 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar43 < puVar3) && ((short)*puVar24 == (short)*puVar43)) {
              puVar43 = (ulong *)((long)puVar43 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar43 < puVar5) {
              puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar43));
            }
            uVar42 = (long)puVar43 - (long)puVar23;
          }
          lVar32 = uVar42 + 8;
          uVar34 = (long)puVar36 - (long)puVar44;
          if (src < puVar36) {
            pBVar22 = pBVar12 + (uVar28 - 1);
            do {
              if ((BYTE)*puVar19 != *pBVar22) goto LAB_001161ac;
              lVar32 = lVar32 + 1;
              puVar36 = (ulong *)((long)puVar19 + -1);
            } while ((pBVar38 < pBVar22) &&
                    (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
LAB_001161a7:
            puVar36 = (ulong *)((long)puVar36 + 1);
          }
        }
        else {
          puVar36 = (ulong *)((long)puVar19 + 4);
          puVar44 = (ulong *)(piVar6 + 1);
          puVar23 = puVar36;
          if (puVar36 < puVar1) {
            if (*puVar44 == *puVar36) {
              lVar32 = 0;
              do {
                puVar44 = (ulong *)((long)puVar19 + lVar32 + 0xc);
                if (puVar1 <= puVar44) {
                  puVar44 = (ulong *)(pBVar12 + lVar32 + uVar40 + 0xc);
                  puVar23 = (ulong *)((long)puVar19 + lVar32 + 0xc);
                  goto LAB_00116058;
                }
                lVar33 = lVar32 + uVar40 + 0xc;
                uVar42 = *puVar44;
                lVar32 = lVar32 + 8;
              } while (*(ulong *)(pBVar12 + lVar33) == uVar42);
              uVar42 = uVar42 ^ *(ulong *)(pBVar12 + lVar33);
              uVar28 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar42 = (uVar28 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar28 = *puVar36 ^ *puVar44;
              uVar42 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                }
              }
              uVar42 = uVar42 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00116058:
            if ((puVar23 < puVar2) && ((int)*puVar44 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar44 = (ulong *)((long)puVar44 + 4);
            }
            if ((puVar23 < puVar3) && ((short)*puVar44 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar44 = (ulong *)((long)puVar44 + 2);
            }
            if (puVar23 < puVar5) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar23));
            }
            uVar42 = (long)puVar23 - (long)puVar36;
          }
          lVar32 = uVar42 + 4;
          uVar34 = (long)puVar19 - (long)piVar6;
          puVar36 = puVar19;
          if (src < puVar19) {
            pBVar22 = pBVar12 + (uVar40 - 1);
            puVar19 = (ulong *)((long)puVar19 + -1);
            do {
              if ((BYTE)*puVar19 != *pBVar22) goto LAB_001161ac;
              lVar32 = lVar32 + 1;
              puVar36 = (ulong *)((long)puVar19 + -1);
            } while ((pBVar38 < pBVar22) &&
                    (pBVar22 = pBVar22 + -1, bVar15 = src < puVar19, puVar19 = puVar36, bVar15));
            goto LAB_001161a7;
          }
        }
        goto LAB_001161b2;
      }
      puVar19 = (ulong *)((long)puVar19 + ((long)puVar19 - (long)src >> 8) + 1);
      goto LAB_001165c3;
    }
    lVar32 = -(ulong)uVar39;
    puVar44 = (ulong *)((long)puVar19 + 5);
    puVar24 = (ulong *)((long)puVar19 + lVar32 + 5);
    puVar23 = puVar44;
    if (puVar44 < puVar1) {
      if (*puVar24 == *puVar44) {
        lVar33 = 0;
        do {
          puVar23 = (ulong *)((long)puVar19 + lVar33 + 0xd);
          if (puVar1 <= puVar23) {
            puVar24 = (ulong *)((long)puVar19 + lVar32 + lVar33 + 0xd);
            puVar23 = (ulong *)((long)puVar19 + lVar33 + 0xd);
            goto LAB_00115da3;
          }
          uVar28 = *(ulong *)((long)puVar19 + lVar33 + lVar32 + 0xd);
          uVar40 = *puVar23;
          lVar33 = lVar33 + 8;
        } while (uVar28 == uVar40);
        uVar40 = uVar40 ^ uVar28;
        uVar28 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = (uVar28 >> 3 & 0x1fffffff) + lVar33;
      }
      else {
        uVar40 = *puVar44 ^ *puVar24;
        uVar28 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = uVar28 >> 3 & 0x1fffffff;
      }
    }
    else {
LAB_00115da3:
      if ((puVar23 < puVar2) && ((int)*puVar24 == (int)*puVar23)) {
        puVar23 = (ulong *)((long)puVar23 + 4);
        puVar24 = (ulong *)((long)puVar24 + 4);
      }
      if ((puVar23 < puVar3) && ((short)*puVar24 == (short)*puVar23)) {
        puVar23 = (ulong *)((long)puVar23 + 2);
        puVar24 = (ulong *)((long)puVar24 + 2);
      }
      if (puVar23 < puVar5) {
        puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar23));
      }
      uVar28 = (long)puVar23 - (long)puVar44;
    }
    if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
        seqStore->maxNbSeq) {
      if (seqStore->maxNbLit < 0x20001) {
        uVar40 = (long)puVar36 - (long)src;
        puVar19 = (ulong *)seqStore->lit;
        if ((BYTE *)((long)puVar19 + uVar40) <= seqStore->litStart + seqStore->maxNbLit) {
          if (puVar36 <= puVar5) {
            if (puVar4 < puVar36) {
              ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar36,(BYTE *)puVar4);
LAB_00115e59:
              seqStore->lit = seqStore->lit + uVar40;
              if (0xffff < uVar40) {
                if (seqStore->longLengthID != 0) goto LAB_00116724;
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
            }
            else {
              uVar34 = *(ulong *)((long)src + 8);
              *puVar19 = *src;
              puVar19[1] = uVar34;
              pBVar22 = seqStore->lit;
              if (0x10 < uVar40) {
                lVar32 = (long)(pBVar22 + 0x10) - ((long)src + 0x10);
                if (lVar32 < 8) {
                  if (-0x10 < lVar32) goto LAB_00116743;
                }
                else if (0xffffffffffffffe0 < lVar32 - 0x10U) goto LAB_00116762;
                uVar34 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar22 + 0x18) = uVar34;
                if (0x20 < (long)uVar40) {
                  lVar32 = 0;
                  do {
                    puVar9 = (undefined8 *)((long)src + lVar32 + 0x20);
                    uVar16 = puVar9[1];
                    pBVar7 = pBVar22 + lVar32 + 0x20;
                    *(undefined8 *)pBVar7 = *puVar9;
                    *(undefined8 *)(pBVar7 + 8) = uVar16;
                    puVar9 = (undefined8 *)((long)src + lVar32 + 0x30);
                    uVar16 = puVar9[1];
                    *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
                    *(undefined8 *)(pBVar7 + 0x18) = uVar16;
                    lVar32 = lVar32 + 0x20;
                  } while (pBVar7 + 0x20 < pBVar22 + uVar40);
                }
                goto LAB_00115e59;
              }
              seqStore->lit = pBVar22 + uVar40;
            }
            lVar32 = uVar28 + 4;
            uVar28 = uVar28 + 1;
            psVar25 = seqStore->sequences;
            psVar25->litLength = (U16)uVar40;
            psVar25->offset = 1;
            if (uVar28 < 0x10000) goto LAB_001162f1;
            if (seqStore->longLengthID == 0) goto LAB_001162db;
            goto LAB_00116705;
          }
          goto LAB_001166a8;
        }
        goto LAB_00116689;
      }
      goto LAB_001166e6;
    }
    goto LAB_001166c7;
  }
LAB_0011663c:
  uVar18 = 0;
  if (uVar29 < uVar17) {
    uVar18 = uVar17;
  }
  if (uVar29 < uVar10) {
    uVar18 = uVar10;
  }
  if (uVar39 == 0) {
    uVar39 = uVar18;
  }
  if (uVar27 != 0) {
    uVar18 = uVar27;
  }
  *rep = uVar39;
  rep[1] = uVar18;
  return (long)puVar5 - (long)src;
LAB_0011559d:
  puVar36 = (ulong *)((long)puVar19 + 1);
LAB_001155a3:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001166c7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001166e6;
  uVar42 = (long)puVar36 - (long)src;
  puVar19 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar42)) goto LAB_00116689;
  if (puVar5 < puVar36) goto LAB_001166a8;
  if (puVar4 < puVar36) {
    ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar36,(BYTE *)puVar4);
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar19 = *src;
    puVar19[1] = uVar40;
    pBVar22 = seqStore->lit;
    if (uVar42 < 0x11) {
      seqStore->lit = pBVar22 + uVar42;
      goto LAB_0011568d;
    }
    lVar33 = (long)(pBVar22 + 0x10) - ((long)src + 0x10);
    if (lVar33 < 8) {
      if (-0x10 < lVar33) goto LAB_00116743;
    }
    else if (0xffffffffffffffe0 < lVar33 - 0x10U) goto LAB_00116762;
    uVar40 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar22 + 0x18) = uVar40;
    if (0x20 < (long)uVar42) {
      lVar33 = 0;
      do {
        puVar9 = (undefined8 *)((long)src + lVar33 + 0x20);
        uVar16 = puVar9[1];
        pBVar7 = pBVar22 + lVar33 + 0x20;
        *(undefined8 *)pBVar7 = *puVar9;
        *(undefined8 *)(pBVar7 + 8) = uVar16;
        puVar9 = (undefined8 *)((long)src + lVar33 + 0x30);
        uVar16 = puVar9[1];
        *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
        *(undefined8 *)(pBVar7 + 0x18) = uVar16;
        lVar33 = lVar33 + 0x20;
      } while (pBVar7 + 0x20 < pBVar22 + uVar42);
    }
  }
  seqStore->lit = seqStore->lit + uVar42;
  if (0xffff < uVar42) {
    if (seqStore->longLengthID != 0) goto LAB_00116724;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0011568d:
  uVar40 = lVar32 - 3;
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar42;
  psVar25->offset = (uint)uVar28 + 3;
  if (uVar40 < 0x10000) {
    uVar42 = (ulong)uVar39;
  }
  else {
    uVar42 = (ulong)uVar39;
    uVar39 = (uint)uVar28;
    if (seqStore->longLengthID != 0) goto LAB_00116705;
LAB_001156c0:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
LAB_001156d6:
    uVar28 = (ulong)uVar39;
  }
  puVar19 = (ulong *)(lVar32 + (long)puVar36);
  psVar25->matchLength = (U16)uVar40;
  psVar25 = psVar25 + 1;
  seqStore->sequences = psVar25;
  if (puVar8 < puVar19) {
    src = puVar19;
    uVar39 = (uint)uVar28;
  }
  else {
    uVar39 = UVar26 + 2;
    lVar32 = *(long *)(pBVar12 + uVar39);
    pUVar13[(ulong)(lVar32 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar39;
    pUVar13[(ulong)(*(long *)((long)puVar19 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)puVar19 + -2) - iVar41;
    pUVar14[(ulong)(lVar32 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = uVar39;
    pUVar14[(ulong)(*(long *)((long)puVar19 + -1) * -0x30e4432345000000) >> (bVar21 & 0x3f)] =
         ((int)puVar19 + -1) - iVar41;
    do {
      uVar40 = uVar42;
      uVar34 = uVar28 & 0xffffffff;
      src = puVar19;
      uVar42 = uVar40;
      uVar39 = (uint)uVar28;
      if (((uint)uVar40 == 0) || ((int)*puVar19 != *(int *)((long)puVar19 - uVar40))) break;
      lVar32 = -uVar40;
      puVar36 = (ulong *)((long)puVar19 + 4);
      puVar23 = (ulong *)((long)puVar19 + lVar32 + 4);
      puVar44 = puVar36;
      if (puVar36 < puVar1) {
        if (*puVar23 == *puVar36) {
          lVar33 = 0;
          do {
            puVar44 = (ulong *)((long)puVar19 + lVar33 + 0xc);
            if (puVar1 <= puVar44) {
              puVar23 = (ulong *)((long)puVar19 + lVar32 + lVar33 + 0xc);
              puVar44 = (ulong *)((long)puVar19 + lVar33 + 0xc);
              goto LAB_00115846;
            }
            uVar42 = *(ulong *)((long)puVar19 + lVar33 + lVar32 + 0xc);
            uVar28 = *puVar44;
            lVar33 = lVar33 + 8;
          } while (uVar42 == uVar28);
          uVar28 = uVar28 ^ uVar42;
          uVar42 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar33;
        }
        else {
          uVar28 = *puVar36 ^ *puVar23;
          uVar42 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00115846:
        if ((puVar44 < puVar2) && ((int)*puVar23 == (int)*puVar44)) {
          puVar44 = (ulong *)((long)puVar44 + 4);
          puVar23 = (ulong *)((long)puVar23 + 4);
        }
        if ((puVar44 < puVar3) && ((short)*puVar23 == (short)*puVar44)) {
          puVar44 = (ulong *)((long)puVar44 + 2);
          puVar23 = (ulong *)((long)puVar23 + 2);
        }
        if (puVar44 < puVar5) {
          puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar44));
        }
        uVar42 = (long)puVar44 - (long)puVar36;
      }
      UVar26 = (int)puVar19 - iVar41;
      uVar28 = *puVar19;
      pUVar14[uVar28 * -0x30e4432345000000 >> (bVar21 & 0x3f)] = UVar26;
      pUVar13[uVar28 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar26;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar25 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001166c7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001166e6;
      puVar36 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar36) goto LAB_00116689;
      if (puVar5 < puVar19) goto LAB_001166a8;
      if (puVar4 < puVar19) {
        ZSTD_safecopyLiterals((BYTE *)puVar36,(BYTE *)puVar19,(BYTE *)puVar19,(BYTE *)puVar4);
      }
      else {
        uVar28 = puVar19[1];
        *puVar36 = *puVar19;
        puVar36[1] = uVar28;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < uVar42 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00116705;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(uVar42 + 1);
      psVar25 = psVar25 + 1;
      seqStore->sequences = psVar25;
      puVar19 = (ulong *)((long)puVar19 + uVar42 + 4);
      uVar42 = uVar34;
      src = puVar19;
      uVar28 = uVar40;
      uVar39 = (uint)uVar40;
    } while (puVar19 <= puVar8);
  }
LAB_001159a6:
  uVar27 = (uint)uVar42;
  if (puVar8 <= puVar19) goto LAB_0011663c;
  goto LAB_00114e83;
LAB_0011497e:
  puVar36 = (ulong *)((long)puVar19 + 1);
LAB_00114984:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001166c7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001166e6;
  uVar42 = (long)puVar36 - (long)src;
  puVar19 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar42)) goto LAB_00116689;
  if (puVar5 < puVar36) goto LAB_001166a8;
  if (puVar4 < puVar36) {
    ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar36,(BYTE *)puVar4);
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar19 = *src;
    puVar19[1] = uVar40;
    pBVar22 = seqStore->lit;
    if (uVar42 < 0x11) {
      seqStore->lit = pBVar22 + uVar42;
      goto LAB_00114a6e;
    }
    lVar33 = (long)(pBVar22 + 0x10) - ((long)src + 0x10);
    if (lVar33 < 8) {
      if (-0x10 < lVar33) goto LAB_00116743;
    }
    else if (0xffffffffffffffe0 < lVar33 - 0x10U) goto LAB_00116762;
    uVar40 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar22 + 0x18) = uVar40;
    if (0x20 < (long)uVar42) {
      lVar33 = 0;
      do {
        puVar9 = (undefined8 *)((long)src + lVar33 + 0x20);
        uVar16 = puVar9[1];
        pBVar7 = pBVar22 + lVar33 + 0x20;
        *(undefined8 *)pBVar7 = *puVar9;
        *(undefined8 *)(pBVar7 + 8) = uVar16;
        puVar9 = (undefined8 *)((long)src + lVar33 + 0x30);
        uVar16 = puVar9[1];
        *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
        *(undefined8 *)(pBVar7 + 0x18) = uVar16;
        lVar33 = lVar33 + 0x20;
      } while (pBVar7 + 0x20 < pBVar22 + uVar42);
    }
  }
  seqStore->lit = seqStore->lit + uVar42;
  if (0xffff < uVar42) {
    if (seqStore->longLengthID != 0) goto LAB_00116724;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00114a6e:
  uVar40 = lVar32 - 3;
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar42;
  psVar25->offset = (uint)uVar28 + 3;
  if (uVar40 < 0x10000) {
    uVar42 = (ulong)uVar39;
  }
  else {
    uVar42 = (ulong)uVar39;
    uVar39 = (uint)uVar28;
    if (seqStore->longLengthID != 0) goto LAB_00116705;
LAB_00114aa1:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
LAB_00114ab7:
    uVar28 = (ulong)uVar39;
  }
  puVar19 = (ulong *)(lVar32 + (long)puVar36);
  psVar25->matchLength = (U16)uVar40;
  psVar25 = psVar25 + 1;
  seqStore->sequences = psVar25;
  if (puVar8 < puVar19) {
    src = puVar19;
    uVar39 = (uint)uVar28;
  }
  else {
    uVar39 = UVar26 + 2;
    lVar32 = *(long *)(pBVar12 + uVar39);
    pUVar13[(ulong)(lVar32 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar39;
    pUVar13[(ulong)(*(long *)((long)puVar19 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)puVar19 + -2) - iVar41;
    pUVar14[(ulong)(lVar32 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = uVar39;
    pUVar14[(ulong)(*(long *)((long)puVar19 + -1) * -0x30e4432340650000) >> (bVar21 & 0x3f)] =
         ((int)puVar19 + -1) - iVar41;
    do {
      uVar40 = uVar42;
      uVar34 = uVar28 & 0xffffffff;
      src = puVar19;
      uVar42 = uVar40;
      uVar39 = (uint)uVar28;
      if (((uint)uVar40 == 0) || ((int)*puVar19 != *(int *)((long)puVar19 - uVar40))) break;
      lVar32 = -uVar40;
      puVar36 = (ulong *)((long)puVar19 + 4);
      puVar23 = (ulong *)((long)puVar19 + lVar32 + 4);
      puVar44 = puVar36;
      if (puVar36 < puVar1) {
        if (*puVar23 == *puVar36) {
          lVar33 = 0;
          do {
            puVar44 = (ulong *)((long)puVar19 + lVar33 + 0xc);
            if (puVar1 <= puVar44) {
              puVar23 = (ulong *)((long)puVar19 + lVar32 + lVar33 + 0xc);
              puVar44 = (ulong *)((long)puVar19 + lVar33 + 0xc);
              goto LAB_00114c27;
            }
            uVar42 = *(ulong *)((long)puVar19 + lVar33 + lVar32 + 0xc);
            uVar28 = *puVar44;
            lVar33 = lVar33 + 8;
          } while (uVar42 == uVar28);
          uVar28 = uVar28 ^ uVar42;
          uVar42 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar33;
        }
        else {
          uVar28 = *puVar36 ^ *puVar23;
          uVar42 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00114c27:
        if ((puVar44 < puVar2) && ((int)*puVar23 == (int)*puVar44)) {
          puVar44 = (ulong *)((long)puVar44 + 4);
          puVar23 = (ulong *)((long)puVar23 + 4);
        }
        if ((puVar44 < puVar3) && ((short)*puVar23 == (short)*puVar44)) {
          puVar44 = (ulong *)((long)puVar44 + 2);
          puVar23 = (ulong *)((long)puVar23 + 2);
        }
        if (puVar44 < puVar5) {
          puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar44));
        }
        uVar42 = (long)puVar44 - (long)puVar36;
      }
      UVar26 = (int)puVar19 - iVar41;
      uVar28 = *puVar19;
      pUVar14[uVar28 * -0x30e4432340650000 >> (bVar21 & 0x3f)] = UVar26;
      pUVar13[uVar28 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar26;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar25 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001166c7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001166e6;
      puVar36 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar36) goto LAB_00116689;
      if (puVar5 < puVar19) goto LAB_001166a8;
      if (puVar4 < puVar19) {
        ZSTD_safecopyLiterals((BYTE *)puVar36,(BYTE *)puVar19,(BYTE *)puVar19,(BYTE *)puVar4);
      }
      else {
        uVar28 = puVar19[1];
        *puVar36 = *puVar19;
        puVar36[1] = uVar28;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < uVar42 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00116705;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(uVar42 + 1);
      psVar25 = psVar25 + 1;
      seqStore->sequences = psVar25;
      puVar19 = (ulong *)((long)puVar19 + uVar42 + 4);
      uVar42 = uVar34;
      src = puVar19;
      uVar28 = uVar40;
      uVar39 = (uint)uVar40;
    } while (puVar19 <= puVar8);
  }
LAB_00114d87:
  uVar27 = (uint)uVar42;
  if (puVar8 <= puVar19) goto LAB_0011663c;
  goto LAB_00114264;
LAB_001161ac:
  puVar36 = (ulong *)((long)puVar19 + 1);
LAB_001161b2:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001166c7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001166e6;
  uVar42 = (long)puVar36 - (long)src;
  puVar19 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar42)) goto LAB_00116689;
  if (puVar5 < puVar36) goto LAB_001166a8;
  if (puVar4 < puVar36) {
    ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar36,(BYTE *)puVar4);
  }
  else {
    uVar28 = *(ulong *)((long)src + 8);
    *puVar19 = *src;
    puVar19[1] = uVar28;
    pBVar22 = seqStore->lit;
    if (uVar42 < 0x11) {
      seqStore->lit = pBVar22 + uVar42;
      goto LAB_001162a9;
    }
    lVar33 = (long)(pBVar22 + 0x10) - ((long)src + 0x10);
    if (lVar33 < 8) {
      if (-0x10 < lVar33) goto LAB_00116743;
    }
    else if (0xffffffffffffffe0 < lVar33 - 0x10U) goto LAB_00116762;
    uVar28 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar22 + 0x18) = uVar28;
    if (0x20 < (long)uVar42) {
      lVar33 = 0;
      do {
        puVar9 = (undefined8 *)((long)src + lVar33 + 0x20);
        uVar16 = puVar9[1];
        pBVar7 = pBVar22 + lVar33 + 0x20;
        *(undefined8 *)pBVar7 = *puVar9;
        *(undefined8 *)(pBVar7 + 8) = uVar16;
        puVar9 = (undefined8 *)((long)src + lVar33 + 0x30);
        uVar16 = puVar9[1];
        *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
        *(undefined8 *)(pBVar7 + 0x18) = uVar16;
        lVar33 = lVar33 + 0x20;
      } while (pBVar7 + 0x20 < pBVar22 + uVar42);
    }
  }
  seqStore->lit = seqStore->lit + uVar42;
  if (0xffff < uVar42) {
    if (seqStore->longLengthID != 0) goto LAB_00116724;
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001162a9:
  uVar28 = lVar32 - 3;
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar42;
  psVar25->offset = (uint)uVar34 + 3;
  if (uVar28 < 0x10000) {
    uVar42 = (ulong)uVar39;
  }
  else {
    uVar42 = (ulong)uVar39;
    uVar39 = (uint)uVar34;
    if (seqStore->longLengthID != 0) goto LAB_00116705;
LAB_001162db:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
LAB_001162f1:
    uVar34 = (ulong)uVar39;
  }
  puVar19 = (ulong *)(lVar32 + (long)puVar36);
  psVar25->matchLength = (U16)uVar28;
  psVar25 = psVar25 + 1;
  seqStore->sequences = psVar25;
  if (puVar8 < puVar19) {
    uVar39 = (uint)uVar34;
    src = puVar19;
  }
  else {
    uVar39 = UVar26 + 2;
    pUVar13[(ulong)(*(long *)(pBVar12 + uVar39) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar39;
    pUVar13[(ulong)(*(long *)((long)puVar19 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)puVar19 + -2) - iVar41;
    pUVar14[(uint)(*(int *)(pBVar12 + uVar39) * -0x61c8864f) >> (bVar21 & 0x1f)] = uVar39;
    pUVar14[(uint)(*(int *)((long)puVar19 + -1) * -0x61c8864f) >> (bVar21 & 0x1f)] =
         ((int)puVar19 + -1) - iVar41;
    uVar28 = uVar42;
    do {
      uVar42 = uVar28;
      uVar27 = (uint)uVar42;
      uVar28 = uVar34 & 0xffffffff;
      uVar39 = (uint)uVar34;
      src = puVar19;
      if ((uVar27 == 0) || ((int)*puVar19 != *(int *)((long)puVar19 - uVar42))) break;
      lVar32 = -uVar42;
      puVar36 = (ulong *)((long)puVar19 + 4);
      puVar23 = (ulong *)((long)puVar19 + lVar32 + 4);
      puVar44 = puVar36;
      if (puVar36 < puVar1) {
        if (*puVar23 == *puVar36) {
          lVar33 = 0;
          do {
            puVar44 = (ulong *)((long)puVar19 + lVar33 + 0xc);
            if (puVar1 <= puVar44) {
              puVar23 = (ulong *)((long)puVar19 + lVar32 + lVar33 + 0xc);
              puVar44 = (ulong *)((long)puVar19 + lVar33 + 0xc);
              goto LAB_00116467;
            }
            uVar40 = *(ulong *)((long)puVar19 + lVar33 + lVar32 + 0xc);
            uVar34 = *puVar44;
            lVar33 = lVar33 + 8;
          } while (uVar40 == uVar34);
          uVar34 = uVar34 ^ uVar40;
          uVar40 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
            }
          }
          uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar33;
        }
        else {
          uVar34 = *puVar36 ^ *puVar23;
          uVar40 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
            }
          }
          uVar40 = uVar40 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00116467:
        if ((puVar44 < puVar2) && ((int)*puVar23 == (int)*puVar44)) {
          puVar44 = (ulong *)((long)puVar44 + 4);
          puVar23 = (ulong *)((long)puVar23 + 4);
        }
        if ((puVar44 < puVar3) && ((short)*puVar23 == (short)*puVar44)) {
          puVar44 = (ulong *)((long)puVar44 + 2);
          puVar23 = (ulong *)((long)puVar23 + 2);
        }
        if (puVar44 < puVar5) {
          puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar44));
        }
        uVar40 = (long)puVar44 - (long)puVar36;
      }
      UVar26 = (int)puVar19 - iVar41;
      pUVar14[(uint)((int)*puVar19 * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar26;
      pUVar13[*puVar19 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar26;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar25 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001166c7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001166e6;
      puVar36 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar36) goto LAB_00116689;
      if (puVar5 < puVar19) goto LAB_001166a8;
      if (puVar4 < puVar19) {
        ZSTD_safecopyLiterals((BYTE *)puVar36,(BYTE *)puVar19,(BYTE *)puVar19,(BYTE *)puVar4);
      }
      else {
        uVar34 = puVar19[1];
        *puVar36 = *puVar19;
        puVar36[1] = uVar34;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < uVar40 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00116705;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(uVar40 + 1);
      psVar25 = psVar25 + 1;
      seqStore->sequences = psVar25;
      puVar19 = (ulong *)((long)puVar19 + uVar40 + 4);
      uVar34 = uVar42;
      src = puVar19;
      uVar42 = uVar28;
      uVar39 = uVar27;
    } while (puVar19 <= puVar8);
  }
LAB_001165c3:
  uVar27 = (uint)uVar42;
  if (puVar8 <= puVar19) goto LAB_0011663c;
  goto LAB_00115a85;
LAB_00113d5f:
  puVar36 = (ulong *)((long)puVar19 + 1);
LAB_00113d65:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_001166c7:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_001166e6:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar42 = (long)puVar36 - (long)src;
  puVar19 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar19 + uVar42)) {
LAB_00116689:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar5 < puVar36) {
LAB_001166a8:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar4 < puVar36) {
    ZSTD_safecopyLiterals((BYTE *)puVar19,(BYTE *)src,(BYTE *)puVar36,(BYTE *)puVar4);
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar19 = *src;
    puVar19[1] = uVar40;
    pBVar22 = seqStore->lit;
    if (uVar42 < 0x11) {
      seqStore->lit = pBVar22 + uVar42;
      goto LAB_00113e4f;
    }
    lVar33 = (long)(pBVar22 + 0x10) - ((long)src + 0x10);
    if (lVar33 < 8) {
      if (-0x10 < lVar33) {
LAB_00116743:
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
    }
    else if (0xffffffffffffffe0 < lVar33 - 0x10U) {
LAB_00116762:
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1270,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    uVar40 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar22 + 0x18) = uVar40;
    if (0x20 < (long)uVar42) {
      lVar33 = 0;
      do {
        puVar9 = (undefined8 *)((long)src + lVar33 + 0x20);
        uVar16 = puVar9[1];
        pBVar7 = pBVar22 + lVar33 + 0x20;
        *(undefined8 *)pBVar7 = *puVar9;
        *(undefined8 *)(pBVar7 + 8) = uVar16;
        puVar9 = (undefined8 *)((long)src + lVar33 + 0x30);
        uVar16 = puVar9[1];
        *(undefined8 *)(pBVar7 + 0x10) = *puVar9;
        *(undefined8 *)(pBVar7 + 0x18) = uVar16;
        lVar33 = lVar33 + 0x20;
      } while (pBVar7 + 0x20 < pBVar22 + uVar42);
    }
  }
  seqStore->lit = seqStore->lit + uVar42;
  if (0xffff < uVar42) {
    if (seqStore->longLengthID != 0) {
LAB_00116724:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x204d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00113e4f:
  uVar40 = lVar32 - 3;
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar42;
  psVar25->offset = (uint)uVar28 + 3;
  if (uVar40 < 0x10000) {
    uVar42 = (ulong)uVar39;
  }
  else {
    uVar42 = (ulong)uVar39;
    uVar39 = (uint)uVar28;
    if (seqStore->longLengthID != 0) {
LAB_00116705:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2058,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
LAB_00113e82:
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
LAB_00113e98:
    uVar28 = (ulong)uVar39;
  }
  puVar19 = (ulong *)(lVar32 + (long)puVar36);
  psVar25->matchLength = (U16)uVar40;
  psVar25 = psVar25 + 1;
  seqStore->sequences = psVar25;
  if (puVar8 < puVar19) {
    src = puVar19;
    uVar39 = (uint)uVar28;
  }
  else {
    uVar39 = UVar26 + 2;
    lVar32 = *(long *)(pBVar12 + uVar39);
    pUVar13[(ulong)(lVar32 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar39;
    pUVar13[(ulong)(*(long *)((long)puVar19 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)puVar19 + -2) - iVar41;
    pUVar14[(ulong)(lVar32 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = uVar39;
    pUVar14[(ulong)(*(long *)((long)puVar19 + -1) * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] =
         ((int)puVar19 + -1) - iVar41;
    do {
      uVar40 = uVar42;
      uVar34 = uVar28 & 0xffffffff;
      src = puVar19;
      uVar42 = uVar40;
      uVar39 = (uint)uVar28;
      if (((uint)uVar40 == 0) || ((int)*puVar19 != *(int *)((long)puVar19 - uVar40))) break;
      lVar32 = -uVar40;
      puVar36 = (ulong *)((long)puVar19 + 4);
      puVar23 = (ulong *)((long)puVar19 + lVar32 + 4);
      puVar44 = puVar36;
      if (puVar36 < puVar1) {
        if (*puVar23 == *puVar36) {
          lVar33 = 0;
          do {
            puVar44 = (ulong *)((long)puVar19 + lVar33 + 0xc);
            if (puVar1 <= puVar44) {
              puVar23 = (ulong *)((long)puVar19 + lVar32 + lVar33 + 0xc);
              puVar44 = (ulong *)((long)puVar19 + lVar33 + 0xc);
              goto LAB_00114008;
            }
            uVar42 = *(ulong *)((long)puVar19 + lVar33 + lVar32 + 0xc);
            uVar28 = *puVar44;
            lVar33 = lVar33 + 8;
          } while (uVar42 == uVar28);
          uVar28 = uVar28 ^ uVar42;
          uVar42 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar33;
        }
        else {
          uVar28 = *puVar36 ^ *puVar23;
          uVar42 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
          uVar42 = uVar42 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00114008:
        if ((puVar44 < puVar2) && ((int)*puVar23 == (int)*puVar44)) {
          puVar44 = (ulong *)((long)puVar44 + 4);
          puVar23 = (ulong *)((long)puVar23 + 4);
        }
        if ((puVar44 < puVar3) && ((short)*puVar23 == (short)*puVar44)) {
          puVar44 = (ulong *)((long)puVar44 + 2);
          puVar23 = (ulong *)((long)puVar23 + 2);
        }
        if (puVar44 < puVar5) {
          puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar44));
        }
        uVar42 = (long)puVar44 - (long)puVar36;
      }
      UVar26 = (int)puVar19 - iVar41;
      uVar28 = *puVar19;
      pUVar14[uVar28 * -0x30e44323405a9d00 >> (bVar21 & 0x3f)] = UVar26;
      pUVar13[uVar28 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar26;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar25 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001166c7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001166e6;
      puVar36 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar36) goto LAB_00116689;
      if (puVar5 < puVar19) goto LAB_001166a8;
      if (puVar4 < puVar19) {
        ZSTD_safecopyLiterals((BYTE *)puVar36,(BYTE *)puVar19,(BYTE *)puVar19,(BYTE *)puVar4);
      }
      else {
        uVar28 = puVar19[1];
        *puVar36 = *puVar19;
        puVar36[1] = uVar28;
      }
      psVar25 = seqStore->sequences;
      psVar25->litLength = 0;
      psVar25->offset = 1;
      if (0xffff < uVar42 + 1) {
        if (seqStore->longLengthID != 0) goto LAB_00116705;
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(uVar42 + 1);
      psVar25 = psVar25 + 1;
      seqStore->sequences = psVar25;
      puVar19 = (ulong *)((long)puVar19 + uVar42 + 4);
      uVar42 = uVar34;
      src = puVar19;
      uVar28 = uVar40;
      uVar39 = (uint)uVar40;
    } while (puVar19 <= puVar8);
  }
LAB_00114168:
  uVar27 = (uint)uVar42;
  if (puVar8 <= puVar19) goto LAB_0011663c;
  goto LAB_00113645;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}